

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall Catch::Config::name_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  pointer pcVar1;
  bool bVar2;
  
  bVar2 = (this->m_data).name._M_string_length == 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (&(this->m_data).name)[bVar2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (&(this->m_data).name)[bVar2]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const { return m_data.name.empty() ? m_data.processName : m_data.name; }